

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cpp
# Opt level: O3

void __thiscall Logger::Impl::formatTime(Impl *this)

{
  char *pcVar1;
  tm *__tp;
  char **ppcVar2;
  time_t time;
  char str_t [26];
  timeval tv;
  __time_t local_50;
  undefined8 local_48;
  undefined2 uStack_40;
  undefined6 uStack_3e;
  undefined2 uStack_38;
  undefined8 uStack_36;
  timeval local_28;
  
  uStack_38 = 0;
  uStack_36 = 0;
  local_48 = 0;
  uStack_40 = 0;
  uStack_3e = 0;
  gettimeofday(&local_28,(__timezone_ptr_t)0x0);
  local_50 = local_28.tv_sec;
  __tp = localtime(&local_50);
  strftime((char *)&local_48,0x1a,"%Y-%m-%d %H:%M:%S\n",__tp);
  pcVar1 = (this->stream_).buffer_.cur_;
  ppcVar2 = &(this->stream_).buffer_.cur_;
  if (8 < (int)ppcVar2 - (int)pcVar1) {
    *(undefined8 *)pcVar1 = local_48;
    *ppcVar2 = *ppcVar2 + 8;
  }
  return;
}

Assistant:

void Logger::Impl::formatTime(){
    struct timeval tv;
    time_t time;
    char str_t[26] = {0};
    gettimeofday(&tv, nullptr);
    time = tv.tv_sec;
    struct tm* p_time = localtime(&time);
    strftime(str_t, 26, "%Y-%m-%d %H:%M:%S\n", p_time);
    stream_<<str_t;
}